

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RS_WheelDD::Initialize
          (RS_WheelDD *this,shared_ptr<chrono::ChBodyAuxRef> *chassis,ChVector<double> *xyz,
          ChVector<double> *rpy)

{
  double *__return_storage_ptr__;
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  ChSystem *pCVar4;
  shared_ptr<chrono::ChLinkBase> local_230;
  ChVector<double> local_220;
  ChCoordsys<double> local_208;
  shared_ptr<chrono::ChBody> local_1d0;
  shared_ptr<chrono::ChBody> local_1c0;
  undefined1 local_1b0 [8];
  shared_ptr<chrono::ChLinkLockRevolute> joint;
  shared_ptr<chrono::collision::ChCollisionModel> local_190;
  shared_ptr<chrono::collision::ChCollisionModel> local_180 [2];
  undefined1 local_160 [8];
  ChFrame<double> X_GC;
  undefined1 local_b8 [8];
  ChFrame<double> X_PC;
  ChFrame<double> *X_GP;
  ChVector<double> *rpy_local;
  ChVector<double> *xyz_local;
  shared_ptr<chrono::ChBodyAuxRef> *chassis_local;
  RS_WheelDD *this_local;
  
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)chassis);
  X_PC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (double)(**(code **)(*(long *)peVar1 + 0x1f0))();
  __return_storage_ptr__ =
       (double *)
       ((long)X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
       0x40);
  rpy2quat((ChQuaternion<double> *)__return_storage_ptr__,rpy);
  ChFrame<double>::ChFrame
            ((ChFrame<double> *)local_b8,xyz,(ChQuaternion<double> *)__return_storage_ptr__);
  ChFrame<double>::operator*
            ((ChFrame<double> *)local_160,
             (ChFrame<double> *)
             X_PC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8],
             (ChFrame<double> *)local_b8);
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  chrono::ChBodyAuxRef::SetFrame_REF_to_abs((ChFrame *)peVar1);
  RS_Part::AddCollisionShapes(&this->super_RS_Part);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_RS_Part).m_body);
  ChBody::GetCollisionModel((ChBody *)local_180);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_180);
  (**(code **)(*(long *)peVar2 + 200))(peVar2,7);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(local_180);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_RS_Part).m_body);
  ChBody::GetCollisionModel((ChBody *)&local_190);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_190);
  (**(code **)(*(long *)peVar2 + 0xd8))(peVar2,5);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_190);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_RS_Part).m_body);
  ChBody::GetCollisionModel
            ((ChBody *)
             &joint.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&joint.
                            super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  (**(code **)(*(long *)peVar2 + 0xd8))(peVar2,6);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr
            ((shared_ptr<chrono::collision::ChCollisionModel> *)
             &joint.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  chrono::ChBody::SetCollide(SUB81(peVar1,0));
  chrono_types::make_shared<chrono::ChLinkLockRevolute,_0>();
  peVar3 = std::
           __shared_ptr_access<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1b0);
  std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>(&local_1c0,chassis);
  std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
            (&local_1d0,&(this->super_RS_Part).m_body);
  ChVector<double>::ChVector(&local_220,0.0,0.0,1.0);
  calcJointFrame(&local_208,(ChFrame<double> *)local_160,&local_220);
  (**(code **)(*(long *)peVar3 + 0x250))(peVar3,&local_1c0,&local_1d0,&local_208);
  std::shared_ptr<chrono::ChBody>::~shared_ptr(&local_1d0);
  std::shared_ptr<chrono::ChBody>::~shared_ptr(&local_1c0);
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)chassis);
  pCVar4 = ChPhysicsItem::GetSystem((ChPhysicsItem *)peVar1);
  std::shared_ptr<chrono::ChLinkBase>::shared_ptr<chrono::ChLinkLockRevolute,void>
            (&local_230,(shared_ptr<chrono::ChLinkLockRevolute> *)local_1b0);
  (**(code **)(*(long *)pCVar4 + 0x138))(pCVar4,&local_230);
  std::shared_ptr<chrono::ChLinkBase>::~shared_ptr(&local_230);
  std::shared_ptr<chrono::ChLinkLockRevolute>::~shared_ptr
            ((shared_ptr<chrono::ChLinkLockRevolute> *)local_1b0);
  ChFrame<double>::~ChFrame((ChFrame<double> *)local_160);
  ChFrame<double>::~ChFrame((ChFrame<double> *)local_b8);
  return;
}

Assistant:

void RS_WheelDD::Initialize(std::shared_ptr<ChBodyAuxRef> chassis, const ChVector<>& xyz, const ChVector<>& rpy) {
    const ChFrame<>& X_GP = chassis->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(xyz, rpy2quat(rpy));                      // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                            // global -> child
    m_body->SetFrame_REF_to_abs(X_GC);

    AddCollisionShapes();

    m_body->GetCollisionModel()->SetFamily(CollisionFamily::WHEEL_DD);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::CHASSIS);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::SLED);

    // Note: call this AFTER setting the collision family (required for Chrono::Multicore)
    m_body->SetCollide(true);

    // Add joint
    auto joint = chrono_types::make_shared<ChLinkLockRevolute>();
    joint->Initialize(chassis, m_body, calcJointFrame(X_GC, ChVector<>(0, 0, 1)));
    chassis->GetSystem()->AddLink(joint);
}